

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

size_t __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base_*>,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>
::prepare_insert(raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base_*>,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>
                 *this,size_t hashval)

{
  FindInfo FVar1;
  
  FVar1 = find_first_non_full(this,hashval);
  if (((this->settings_).
       super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
       .
       super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>,_0UL,_false>
       .value == 0) && (this->ctrl_[FVar1.offset] != -2)) {
    rehash_and_grow_if_necessary(this);
    FVar1 = find_first_non_full(this,hashval);
  }
  this->size_ = this->size_ + 1;
  (this->settings_).
  super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  .
  super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>,_0UL,_false>
  .value = (this->settings_).
           super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
           .
           super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>,_0UL,_false>
           .value - (ulong)(this->ctrl_[FVar1.offset] == -0x80);
  return FVar1.offset;
}

Assistant:

size_t prepare_insert(size_t hashval) PHMAP_ATTRIBUTE_NOINLINE {
				auto target = find_first_non_full(hashval);
				if (PHMAP_PREDICT_FALSE(growth_left() == 0 &&
				                        !IsDeleted(ctrl_[target.offset])))
				{
					rehash_and_grow_if_necessary();
					target = find_first_non_full(hashval);
				}
				++size_;
				growth_left() -= IsEmpty(ctrl_[target.offset]);
				// set_ctrl(target.offset, H2(hashval));
				infoz_.RecordInsert(hashval, target.probe_length);
				return target.offset;
			}